

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_math.cpp
# Opt level: O0

bool pvmath::parallelLine<float>(void)

{
  undefined8 uVar1;
  uint uVar2;
  uint32_t uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  LineBase2D<float> line2;
  bool inverse;
  PointBase2D<float> offset;
  LineBase2D<float> line1;
  PointBase2D<float> point2;
  PointBase2D<float> point1;
  uint32_t i;
  LineBase2D<float> *in_stack_ffffffffffffff88;
  LineBase2D<float> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  LineBase2D<float> *in_stack_ffffffffffffffc0;
  PointBase2D<float> local_30 [3];
  undefined1 local_18 [16];
  uint local_8;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  local_8 = 0;
  while( true ) {
    uVar2 = local_8;
    fVar7 = SUB84(in_stack_ffffffffffffff90,0);
    uVar3 = Test_Helper::runCount();
    if (uVar3 <= uVar2) {
      return true;
    }
    fVar5 = Unit_Test::randomFloatValue<float>
                      (fVar7,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       SUB84(in_stack_ffffffffffffff88,0));
    fVar6 = Unit_Test::randomFloatValue<float>
                      (fVar7,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       SUB84(in_stack_ffffffffffffff88,0));
    PointBase2D<float>::PointBase2D((PointBase2D<float> *)(local_18 + 8),fVar5,fVar6);
    fVar5 = Unit_Test::randomFloatValue<float>
                      (fVar7,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       SUB84(in_stack_ffffffffffffff88,0));
    fVar6 = Unit_Test::randomFloatValue<float>
                      (fVar7,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       SUB84(in_stack_ffffffffffffff88,0));
    PointBase2D<float>::PointBase2D((PointBase2D<float> *)local_18,fVar5,fVar6);
    LineBase2D<float>::LineBase2D
              (in_stack_ffffffffffffffc0,
               (PointBase2D<float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (PointBase2D<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    fVar5 = Unit_Test::randomFloatValue<float>
                      (fVar7,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       SUB84(in_stack_ffffffffffffff88,0));
    fVar7 = Unit_Test::randomFloatValue<float>
                      (fVar7,(float)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       SUB84(in_stack_ffffffffffffff88,0));
    PointBase2D<float>::PointBase2D(local_30,fVar5,fVar7);
    bVar4 = (local_8 & 1) != 0;
    if (bVar4) {
      in_stack_ffffffffffffff90 = (LineBase2D<float> *)local_18;
    }
    else {
      in_stack_ffffffffffffff90 = (LineBase2D<float> *)(local_18 + 8);
    }
    auVar8._0_8_ = PointBase2D<float>::operator+
                             (&in_stack_ffffffffffffff88->_position,(PointBase2D<float> *)0x24bd68);
    auVar8._8_56_ = extraout_var;
    uVar1 = vmovlpd_avx(auVar8._0_16_);
    in_stack_ffffffffffffffb4 = (undefined4)uVar1;
    in_stack_ffffffffffffffb8 = (undefined4)((ulong)uVar1 >> 0x20);
    if (bVar4) {
      in_stack_ffffffffffffff88 = (LineBase2D<float> *)(local_18 + 8);
    }
    else {
      in_stack_ffffffffffffff88 = (LineBase2D<float> *)local_18;
    }
    auVar9._0_8_ = PointBase2D<float>::operator+
                             (&in_stack_ffffffffffffff88->_position,(PointBase2D<float> *)0x24bd99);
    auVar9._8_56_ = extraout_var_00;
    uVar1 = vmovlpd_avx(auVar9._0_16_);
    in_stack_ffffffffffffffb0 = (undefined4)((ulong)uVar1 >> 0x20);
    LineBase2D<float>::LineBase2D
              (in_stack_ffffffffffffffc0,
               (PointBase2D<float> *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
               (PointBase2D<float> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
    bVar4 = LineBase2D<float>::isParallel(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!bVar4) break;
    local_8 = local_8 + 1;
  }
  return false;
}

Assistant:

bool parallelLine()
    {
        for( uint32_t i = 0; i < Unit_Test::runCount(); ++i ) {
            const PointBase2D<_Type> point1( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const PointBase2D<_Type> point2( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const LineBase2D<_Type> line1( point1, point2 );

            const PointBase2D<_Type> offset( Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ), Unit_Test::randomFloatValue<_Type>( -1000, 1000, 0.01f ) );
            const bool inverse = ( (i % 2) == 0 );
            const LineBase2D<_Type> line2( (inverse ? point1 : point2) + offset, (inverse ? point2 : point1) + offset );
            if ( !line1.isParallel( line2 ) )
                return false;
        }
        return true;
    }